

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

int Ga2_ObjSatValue(Ga2_Man_t *p,Gia_Obj_t *pObj,int f)

{
  sat_solver2 *psVar1;
  int Lit;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  Lit = Ga2_ObjFindLit(p,pObj,f);
  if ((~*(ulong *)pObj & 0x1fffffff1fffffff) == 0) {
    __assert_fail("!Gia_ObjIsConst0(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                  ,0x487,"int Ga2_ObjSatValue(Ga2_Man_t *, Gia_Obj_t *, int)");
  }
  uVar3 = 0;
  if (Lit != -1) {
    iVar2 = Abc_Lit2Var(Lit);
    uVar3 = 0;
    if (iVar2 < p->pSat->size) {
      uVar3 = Abc_LitIsCompl(Lit);
      psVar1 = p->pSat;
      uVar4 = Abc_Lit2Var(Lit);
      if (psVar1->size <= (int)uVar4) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver2.h"
                      ,0xd4,"int sat_solver2_var_value(sat_solver2 *, int)");
      }
      uVar3 = uVar3 ^ psVar1->model[uVar4] == 1;
    }
  }
  return uVar3;
}

Assistant:

static inline int Ga2_ObjSatValue( Ga2_Man_t * p, Gia_Obj_t * pObj, int f )
{
    int Lit = Ga2_ObjFindLit( p, pObj, f );
    assert( !Gia_ObjIsConst0(pObj) );
    if ( Lit == -1 )
        return 0;
    if ( Abc_Lit2Var(Lit) >= p->pSat->size )
        return 0;
    return Abc_LitIsCompl(Lit) ^ sat_solver2_var_value( p->pSat, Abc_Lit2Var(Lit) );
}